

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O0

unsigned_short
beast::lexicalCast<unsigned_short,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in,
          unsigned_short defaultValue)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  unsigned_short local_1c;
  unsigned_short local_1a;
  unsigned_short out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_18;
  unsigned_short defaultValue_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_local;
  
  local_1a = defaultValue;
  pbStack_18 = in;
  std::__cxx11::string::string((string *)&local_40,(string *)in);
  bVar1 = lexicalCastChecked<unsigned_short,std::__cxx11::string>(&local_1c,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    in_local._6_2_ = local_1c;
  }
  else {
    in_local._6_2_ = local_1a;
  }
  return in_local._6_2_;
}

Assistant:

Out lexicalCast (In in, Out defaultValue = Out ())
{
    Out out;

    if (lexicalCastChecked (out, in))
        return out;

    return defaultValue;
}